

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O1

_Bool effect_handler_PROJECT_LOS(effect_handler_context_t *context)

{
  wchar_t typ;
  loc finish;
  _Bool _Var1;
  wchar_t dam;
  wchar_t wVar2;
  wchar_t wVar3;
  loc grid1;
  monster *pmVar4;
  source origin;
  source sVar5;
  
  dam = effect_calculate_value((effect_handler_context_t_conflict *)context,context->other != L'\0')
  ;
  typ = context->subtype;
  sVar5._4_4_ = 0;
  sVar5.what = (context->origin).what;
  sVar5.which.trap = (context->origin).which.trap;
  grid1 = origin_get_loc(sVar5);
  wVar2 = cave_monster_max(cave);
  if (L'\x01' < wVar2) {
    wVar2 = L'\x01';
    do {
      pmVar4 = cave_monster(cave,wVar2);
      if ((pmVar4->race != (monster_race *)0x0) && (pmVar4->midx != cave->mon_current)) {
        _Var1 = los(cave,(loc_conflict)grid1,pmVar4->grid);
        if (_Var1) {
          sVar5 = source_player();
          finish.x = (pmVar4->grid).x;
          finish.y = (pmVar4->grid).y;
          origin._4_4_ = 0;
          origin.what = sVar5.what;
          origin.which.trap = sVar5.which.trap;
          project(origin,L'\0',finish,dam,typ,L'Á',L'\0','\0',context->obj);
          context->ident = true;
        }
      }
      wVar2 = wVar2 + L'\x01';
      wVar3 = cave_monster_max(cave);
    } while (wVar2 < wVar3);
  }
  return true;
}

Assistant:

bool effect_handler_PROJECT_LOS(effect_handler_context_t *context)
{
	int i;
	int dam = effect_calculate_value(context, context->other ? true : false);
	int typ = context->subtype;
	struct loc origin = origin_get_loc(context->origin);
	int flg = PROJECT_JUMP | PROJECT_KILL | PROJECT_HIDE;

	/* Affect all (nearby) monsters */
	for (i = 1; i < cave_monster_max(cave); i++) {
		struct monster *mon = cave_monster(cave, i);

		/* Paranoia -- Skip dead monsters */
		if (!mon->race) continue;

		/* Don't affect the caster */
		if (mon->midx == cave->mon_current) continue;

		/* Require line of sight */
		if (!los(cave, origin, mon->grid)) continue;

		/* Jump directly to the monster */
		(void)project(source_player(), 0, mon->grid, dam, typ, flg, 0, 0,
					  context->obj);
		context->ident = true;
	}

	/* Result */
	return true;
}